

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cli.c
# Opt level: O2

int ssl_write_encrypted_pms(mbedtls_ssl_context *ssl,size_t offset,size_t *olen,size_t pms_offset)

{
  ulong uVar1;
  int iVar2;
  mbedtls_ssl_handshake_params *pmVar3;
  mbedtls_ssl_config *pmVar4;
  mbedtls_x509_crt *pmVar5;
  int iVar6;
  uchar *ver;
  ulong uVar7;
  
  iVar2 = ssl->minor_ver;
  uVar7 = (ulong)((uint)(iVar2 != 0) * 2);
  uVar1 = offset + uVar7;
  iVar6 = -0x6a00;
  if (uVar1 < 0x4001) {
    pmVar3 = ssl->handshake;
    ver = pmVar3->premaster + pms_offset;
    pmVar4 = ssl->conf;
    mbedtls_ssl_write_version
              ((uint)pmVar4->max_major_ver,(uint)pmVar4->max_minor_ver,
               *(uint *)&pmVar4->field_0x174 >> 1 & 1,ver);
    iVar6 = (*ssl->conf->f_rng)(ssl->conf->p_rng,pmVar3->premaster + pms_offset + 2,0x2e);
    if (iVar6 == 0) {
      ssl->handshake->pmslen = 0x30;
      pmVar5 = ssl->session_negotiate->peer_cert;
      if (pmVar5 == (mbedtls_x509_crt *)0x0) {
        iVar6 = -0x7700;
      }
      else {
        iVar6 = mbedtls_pk_can_do(&pmVar5->pk,MBEDTLS_PK_RSA);
        if (iVar6 == 0) {
          iVar6 = -0x6d00;
        }
        else {
          iVar6 = mbedtls_pk_encrypt(&ssl->session_negotiate->peer_cert->pk,ver,
                                     ssl->handshake->pmslen,ssl->out_msg + uVar7 + offset,olen,
                                     0x4000 - uVar1,
                                     (_func_int_void_ptr_uchar_ptr_size_t *)ssl->conf->f_rng,
                                     ssl->conf->p_rng);
          if ((iVar2 != 0) && (iVar6 == 0)) {
            ssl->out_msg[offset] = *(uchar *)((long)olen + 1);
            ssl->out_msg[offset + 1] = (uchar)*olen;
            *olen = *olen + 2;
            iVar6 = 0;
          }
        }
      }
    }
  }
  return iVar6;
}

Assistant:

static int ssl_write_encrypted_pms( mbedtls_ssl_context *ssl,
                                    size_t offset, size_t *olen,
                                    size_t pms_offset )
{
    int ret;
    size_t len_bytes = ssl->minor_ver == MBEDTLS_SSL_MINOR_VERSION_0 ? 0 : 2;
    unsigned char *p = ssl->handshake->premaster + pms_offset;

    if( offset + len_bytes > MBEDTLS_SSL_MAX_CONTENT_LEN )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "buffer too small for encrypted pms" ) );
        return( MBEDTLS_ERR_SSL_BUFFER_TOO_SMALL );
    }

    /*
     * Generate (part of) the pre-master as
     *  struct {
     *      ProtocolVersion client_version;
     *      opaque random[46];
     *  } PreMasterSecret;
     */
    mbedtls_ssl_write_version( ssl->conf->max_major_ver, ssl->conf->max_minor_ver,
                       ssl->conf->transport, p );

    if( ( ret = ssl->conf->f_rng( ssl->conf->p_rng, p + 2, 46 ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "f_rng", ret );
        return( ret );
    }

    ssl->handshake->pmslen = 48;

    if( ssl->session_negotiate->peer_cert == NULL )
    {
        MBEDTLS_SSL_DEBUG_MSG( 2, ( "certificate required" ) );
        return( MBEDTLS_ERR_SSL_UNEXPECTED_MESSAGE );
    }

    /*
     * Now write it out, encrypted
     */
    if( ! mbedtls_pk_can_do( &ssl->session_negotiate->peer_cert->pk,
                MBEDTLS_PK_RSA ) )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "certificate key type mismatch" ) );
        return( MBEDTLS_ERR_SSL_PK_TYPE_MISMATCH );
    }

    if( ( ret = mbedtls_pk_encrypt( &ssl->session_negotiate->peer_cert->pk,
                            p, ssl->handshake->pmslen,
                            ssl->out_msg + offset + len_bytes, olen,
                            MBEDTLS_SSL_MAX_CONTENT_LEN - offset - len_bytes,
                            ssl->conf->f_rng, ssl->conf->p_rng ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_rsa_pkcs1_encrypt", ret );
        return( ret );
    }

#if defined(MBEDTLS_SSL_PROTO_TLS1) || defined(MBEDTLS_SSL_PROTO_TLS1_1) || \
    defined(MBEDTLS_SSL_PROTO_TLS1_2)
    if( len_bytes == 2 )
    {
        ssl->out_msg[offset+0] = (unsigned char)( *olen >> 8 );
        ssl->out_msg[offset+1] = (unsigned char)( *olen      );
        *olen += 2;
    }
#endif

    return( 0 );
}